

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::to_sampler_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t id)

{
  char *pcVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string expr;
  string local_30;
  
  CompilerGLSL::to_non_uniform_aware_expression_abi_cxx11_(&local_30,&this->super_CompilerGLSL,id);
  join<char_const(&)[2],std::__cxx11::string>
            (&expr,(spirv_cross *)0x2ae00b,(char (*) [2])&local_30,in_RCX);
  ::std::__cxx11::string::~string((string *)&local_30);
  pcVar1 = (char *)::std::__cxx11::string::find((char)&expr,0x5b);
  if (pcVar1 == (char *)0xffffffffffffffff) {
    ::std::operator+(__return_storage_ptr__,&expr,"_sampler");
  }
  else {
    psVar2 = (string *)::std::__cxx11::string::insert((ulong)&expr,pcVar1);
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,psVar2);
  }
  ::std::__cxx11::string::~string((string *)&expr);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_sampler_expression(uint32_t id)
{
	auto expr = join("_", to_non_uniform_aware_expression(id));
	auto index = expr.find_first_of('[');
	if (index == string::npos)
	{
		return expr + "_sampler";
	}
	else
	{
		// We have an expression like _ident[array], so we cannot tack on _sampler, insert it inside the string instead.
		return expr.insert(index, "_sampler");
	}
}